

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

void __thiscall pbrt::CameraBase::CameraBase(CameraBase *this,CameraBaseParameters *p)

{
  bool bVar1;
  Medium *in_RSI;
  void *in_RDI;
  char *in_stack_00000010;
  Medium *in_stack_ffffffffffffffd8;
  
  memcpy(in_RDI,in_RSI,0x338);
  *(int *)((long)in_RDI + 0x338) =
       (int)((TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm,_pbrt::SpectralFilm> *)
            &in_RSI[0x67].
             super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GridMedium,_pbrt::RGBGridMedium,_pbrt::CloudMedium,_pbrt::NanoVDBMedium>
            )->bits;
  *(undefined4 *)((long)in_RDI + 0x33c) =
       *(undefined4 *)
        ((long)&((TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm,_pbrt::SpectralFilm> *)
                &in_RSI[0x67].
                 super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GridMedium,_pbrt::RGBGridMedium,_pbrt::CloudMedium,_pbrt::NanoVDBMedium>
                )->bits + 4);
  Film::Film((Film *)in_RSI,(Film *)in_stack_ffffffffffffffd8);
  Medium::Medium(in_RSI,in_stack_ffffffffffffffd8);
  Vector3<float>::Vector3((Vector3<float> *)0x89d732);
  Vector3<float>::Vector3((Vector3<float> *)0x89d743);
  Vector3<float>::Vector3((Vector3<float> *)0x89d754);
  Vector3<float>::Vector3((Vector3<float> *)0x89d765);
  bVar1 = CameraTransform::CameraFromRenderHasScale((CameraTransform *)0x89d76f);
  if (bVar1) {
    Warning<>(in_stack_00000010);
  }
  return;
}

Assistant:

CameraBase::CameraBase(CameraBaseParameters p)
    : cameraTransform(p.cameraTransform),
      shutterOpen(p.shutterOpen),
      shutterClose(p.shutterClose),
      film(p.film),
      medium(p.medium) {
    if (cameraTransform.CameraFromRenderHasScale())
        Warning("Scaling detected in rendering space to camera space transformation!\n"
                "The system has numerous assumptions, implicit and explicit,\n"
                "that this transform will have no scale factors in it.\n"
                "Proceed at your own risk; your image may have errors or\n"
                "the system may crash as a result of this.");
}